

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBegin_advanced_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 unsigned_long_long pledgedSrcSize)

{
  ulong uVar1;
  
  uVar1 = 0xffffffffffffffd6;
  if ((((0xffffffe9 < (params->cParams).windowLog - 0x20) &&
       (0xffffffe6 < (params->cParams).chainLog - 0x1f)) &&
      (0xffffffe6 < (params->cParams).hashLog - 0x1f)) &&
     (((0xffffffe1 < (params->cParams).searchLog - 0x1f &&
       (0xfffffffa < (params->cParams).minMatch - 8)) && ((params->cParams).targetLength < 0x20001))
     )) {
    uVar1 = 0xffffffffffffffd6;
    if (0xfffffff6 < (params->cParams).strategy + ~ZSTD_btultra2) {
      uVar1 = 0;
    }
  }
  if (uVar1 < 0xffffffffffffff89) {
    uVar1 = ZSTD_compressBegin_internal
                      (cctx,dict,dictSize,dictContentType,dtlm,cdict,params,pledgedSrcSize,
                       ZSTDb_not_buffered);
  }
  return uVar1;
}

Assistant:

size_t ZSTD_compressBegin_advanced_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params,
                                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_advanced_internal: wlog=%u", params->cParams.windowLog);
    /* compression parameters verification and optimization */
    FORWARD_IF_ERROR( ZSTD_checkCParams(params->cParams) , "");
    return ZSTD_compressBegin_internal(cctx,
                                       dict, dictSize, dictContentType, dtlm,
                                       cdict,
                                       params, pledgedSrcSize,
                                       ZSTDb_not_buffered);
}